

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.h
# Opt level: O0

void __thiscall crnlib::dxt_image::pack_params::clear(pack_params *this)

{
  pack_params *this_local;
  
  this->m_quality = cCRNDXTQualityUber;
  this->m_perceptual = true;
  this->m_dithering = false;
  this->m_grayscale_sampling = false;
  this->m_use_both_block_types = true;
  this->m_endpoint_caching = true;
  this->m_compressor = cCRNDXTCompressorCRN;
  this->m_pProgress_callback = (progress_callback_func)0x0;
  this->m_pProgress_callback_user_data_ptr = (void *)0x0;
  this->m_dxt1a_alpha_threshold = 0x80;
  this->m_num_helper_threads = 0;
  this->m_progress_start = 0;
  this->m_progress_range = 100;
  this->m_use_transparent_indices_for_black = false;
  this->m_pTask_pool = (task_pool *)0x0;
  return;
}

Assistant:

void clear()
            {
                m_quality = cCRNDXTQualityUber;
                m_perceptual = true;
                m_dithering = false;
                m_grayscale_sampling = false;
                m_use_both_block_types = true;
                m_endpoint_caching = true;
                m_compressor = cCRNDXTCompressorCRN;
                m_pProgress_callback = nullptr;
                m_pProgress_callback_user_data_ptr = nullptr;
                m_dxt1a_alpha_threshold = 128;
                m_num_helper_threads = 0;
                m_progress_start = 0;
                m_progress_range = 100;
                m_use_transparent_indices_for_black = false;
                m_pTask_pool = nullptr;
            }